

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

void __thiscall
Clasp::MinimizeBuilder::mergeLevels(MinimizeBuilder *this,SumVec *adjust,WeightVec *weights)

{
  pointer pMVar1;
  pointer pLVar2;
  long *plVar3;
  size_type sVar4;
  int iVar5;
  weight_t wVar6;
  MLit *pMVar7;
  uint uVar8;
  ulong uVar9;
  pointer pMVar10;
  size_type n;
  pointer pMVar11;
  MLit *local_68;
  _Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit> local_58;
  MinimizeBuilder *local_40;
  SumVec *local_38;
  
  local_68 = (this->lits_).ebo_.buf;
  uVar9 = (ulong)(this->lits_).ebo_.size;
  uVar8 = 0;
  local_38 = adjust;
  if (uVar9 == 0) {
    n = 0;
  }
  else {
    std::_Temporary_buffer<Clasp::MinimizeBuilder::MLit_*,_Clasp::MinimizeBuilder::MLit>::
    _Temporary_buffer(&local_58,local_68,uVar9 + 1 >> 1);
    if (local_58._M_buffer == (pointer)0x0) {
      std::
      __inplace_stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpLit>>
                (local_68,local_68 + uVar9);
    }
    else {
      std::
      __stable_sort_adaptive<Clasp::MinimizeBuilder::MLit*,Clasp::MinimizeBuilder::MLit*,long,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpLit>>
                (local_68,local_68 + uVar9,local_58._M_buffer,local_58._M_len);
    }
    operator_delete(local_58._M_buffer);
    local_68 = (this->lits_).ebo_.buf;
    n = (this->lits_).ebo_.size;
  }
  (weights->ebo_).size = 0;
  bk_lib::
  pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
  ::reserve(weights,n);
  pMVar11 = (this->lits_).ebo_.buf;
  uVar9 = (ulong)(this->lits_).ebo_.size;
  if (uVar9 != 0) {
    pMVar1 = pMVar11 + uVar9;
    pMVar7 = local_68;
    local_40 = this;
    do {
      local_68 = pMVar7;
      sVar4 = (weights->ebo_).size;
      local_58._M_original_len._4_4_ = pMVar11->weight;
      local_58._M_original_len._0_4_ = pMVar11->prio & 0x7fffffff;
      bk_lib::
      pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
      ::push_back(weights,(LevelWeight *)&local_58);
      pMVar10 = pMVar11 + 1;
      if (pMVar10 == pMVar1) {
LAB_00151d37:
        wVar6 = pMVar11->prio;
        local_68->lit = (Literal)(pMVar11->lit).rep_;
        local_68->prio = wVar6;
        local_68->weight = sVar4;
        break;
      }
      uVar8 = (pMVar11->lit).rep_;
      while ((uVar8 ^ (pMVar10->lit).rep_) < 4) {
        pLVar2 = (weights->ebo_).buf + ((weights->ebo_).size - 1);
        *(uint *)pLVar2 = *(uint *)pLVar2 | 0x80000000;
        local_58._M_original_len._4_4_ = pMVar10->weight;
        local_58._M_original_len._0_4_ = pMVar10->prio & 0x7fffffff;
        bk_lib::
        pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
        ::push_back(weights,(LevelWeight *)&local_58);
        uVar8 = (pMVar11->lit).rep_;
        if (((byte)(pMVar10->lit).rep_ & 2) >> 1 != (byte)((uVar8 & 2) >> 1)) {
          iVar5 = pMVar10->weight;
          plVar3 = (local_38->ebo_).buf + (uint)pMVar10->prio;
          *plVar3 = *plVar3 + (long)iVar5;
          (weights->ebo_).buf[(weights->ebo_).size - 1].weight = -iVar5;
        }
        pMVar10 = pMVar10 + 1;
        if (pMVar10 == pMVar1) goto LAB_00151d37;
      }
      wVar6 = pMVar11->prio;
      local_68->lit = (Literal)(pMVar11->lit).rep_;
      local_68->prio = wVar6;
      local_68->weight = sVar4;
      pMVar11 = pMVar10;
      pMVar7 = local_68 + 1;
    } while (pMVar10 != pMVar1);
    local_68 = local_68 + 1;
    pMVar11 = (local_40->lits_).ebo_.buf;
    uVar8 = (local_40->lits_).ebo_.size;
    this = local_40;
  }
  (this->lits_).ebo_.size =
       (int)((long)pMVar11 + ((ulong)uVar8 * 0xc - (long)local_68) >> 2) * 0x55555555 + uVar8;
  return;
}

Assistant:

void MinimizeBuilder::mergeLevels(SumVec& adjust, SharedData::WeightVec& weights) {
	// group first by variables and then by increasing levels
	std::stable_sort(lits_.begin(), lits_.end(), CmpLit());
	LitVec::iterator j = lits_.begin();
	weights.clear(); weights.reserve(lits_.size());
	for (LitVec::const_iterator it = lits_.begin(), end = lits_.end(), k; it != end; it = k) {
		// handle first occurrence of var
		assert(it->weight > 0 && "most important occurrence of lit must have positive weight");
		weight_t wpos = (weight_t)weights.size();
		weights.push_back(SharedData::LevelWeight(it->prio, it->weight));
		// handle remaining occurrences with lower prios
		for (k = it + 1; k != end && k->lit.var() == it->lit.var(); ++k) {
			assert(k->prio > it->prio && "levels not prepared!");
			weights.back().next = 1;
			weights.push_back(SharedData::LevelWeight(k->prio, k->weight));
			if (k->lit.sign() != it->lit.sign()) {
				adjust[k->prio] += k->weight;
				weights.back().weight = -k->weight;
			}
		}
		(*j = *it).weight = wpos;
		++j;
	}
	lits_.erase(j, lits_.end());
}